

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum4096_32.c
# Opt level: O0

_Bool Hacl_Bignum4096_32_mod_inv_prime_vartime(uint32_t *n,uint32_t *a,uint32_t *res)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  bool bVar7;
  uint32_t c2;
  uint32_t c1;
  uint32_t *res_i_3;
  uint32_t t1_3;
  uint32_t *res_i_2;
  uint32_t t1_2;
  uint32_t *res_i_1;
  uint32_t t1_1;
  uint32_t i_4;
  uint32_t *res_i;
  uint32_t t12;
  uint32_t *res_i2;
  uint32_t t11;
  uint32_t *res_i1;
  uint32_t t10;
  uint32_t *res_i0;
  uint local_768;
  uint32_t t1;
  uint32_t i_3;
  uint32_t c;
  uint32_t *res1;
  uint32_t *a1;
  uint32_t local_748;
  uint32_t c0;
  uint32_t n2 [128];
  uint32_t nBits;
  uint32_t is_valid_m;
  uint32_t m2;
  uint32_t blt_1;
  uint32_t beq_1;
  uint32_t i_2;
  uint32_t acc;
  uint32_t m10;
  uint32_t res10;
  uint32_t mask1;
  uint32_t uu____0;
  uint32_t i_1;
  uint32_t mask;
  uint32_t bn_zero [128];
  uint32_t m00;
  uint32_t m1;
  uint32_t blt;
  uint32_t beq;
  uint32_t i;
  uint32_t acc0;
  uint32_t m0;
  uint32_t bit0;
  uint32_t one [128];
  uint32_t *res_local;
  uint32_t *a_local;
  uint32_t *n_local;
  
  memset(&m0,0,0x200);
  memset(&m0,0,0x200);
  m0 = 1;
  uVar6 = *n;
  beq = 0;
  for (blt = 0; blt < 0x80; blt = blt + 1) {
    uVar4 = FStar_UInt32_eq_mask((&m0)[blt],n[blt]);
    uVar5 = FStar_UInt32_gte_mask((&m0)[blt],n[blt]);
    beq = uVar4 & beq | (uVar4 ^ 0xffffffff) & (uVar5 ^ 0xffffffff);
  }
  bn_zero[0x7f] = beq;
  bn_zero[0x7e] = -(uVar6 & 1) & beq;
  memset(&i_1,0,0x200);
  uu____0 = 0xffffffff;
  for (mask1 = 0; mask1 < 0x80; mask1 = mask1 + 1) {
    uVar4 = FStar_UInt32_eq_mask(a[mask1],(&i_1)[mask1]);
    uu____0 = uVar4 & uu____0;
  }
  beq_1 = 0;
  for (blt_1 = 0; blt_1 < 0x80; blt_1 = blt_1 + 1) {
    uVar4 = FStar_UInt32_eq_mask(a[blt_1],n[blt_1]);
    uVar5 = FStar_UInt32_gte_mask(a[blt_1],n[blt_1]);
    beq_1 = uVar4 & beq_1 | (uVar4 ^ 0xffffffff) & (uVar5 ^ 0xffffffff);
  }
  uVar6 = bn_zero[0x7e] & (uu____0 ^ 0xffffffff) & beq_1;
  uVar4 = Hacl_Bignum_Lib_bn_get_top_index_u32(0x80,n);
  if (uVar6 == 0xffffffff) {
    memset(&local_748,0,0x200);
    bVar7 = *n < 2;
    local_748 = *n - 2;
    for (local_768 = 0; local_768 < 0x1f; local_768 = local_768 + 1) {
      uVar1 = n[(ulong)(local_768 << 2) + 1];
      n2[(ulong)(local_768 << 2) - 1] = uVar1 - bVar7;
      uVar2 = n[(ulong)(local_768 * 4 + 1) + 1];
      uVar3 = (uint)(uVar1 < bVar7);
      n2[local_768 << 2] = uVar2 - uVar3;
      uVar1 = n[(ulong)(local_768 * 4 + 2) + 1];
      uVar2 = (uint)(uVar2 < uVar3);
      n2[(ulong)(local_768 << 2) + 1] = uVar1 - uVar2;
      uVar1 = (uint)(uVar1 < uVar2);
      bVar7 = n[(ulong)(local_768 * 4 + 3) + 1] < uVar1;
      n2[(ulong)(local_768 << 2) + 2] = n[(ulong)(local_768 * 4 + 3) + 1] - uVar1;
    }
    n2[0x7b] = n[0x7d] - (uint)bVar7;
    uVar1 = (uint)(n[0x7d] < (uint)bVar7);
    n2[0x7c] = n[0x7e] - uVar1;
    n2[0x7d] = n[0x7f] - (uint)(n[0x7e] < uVar1);
    exp_vartime(uVar4 << 5,n,a,0x1000,&local_748,res);
  }
  else {
    memset(res,0,0x200);
  }
  return uVar6 == 0xffffffff;
}

Assistant:

bool Hacl_Bignum4096_32_mod_inv_prime_vartime(uint32_t *n, uint32_t *a, uint32_t *res)
{
  uint32_t one[128U] = { 0U };
  memset(one, 0U, 128U * sizeof (uint32_t));
  one[0U] = 1U;
  uint32_t bit0 = n[0U] & 1U;
  uint32_t m0 = 0U - bit0;
  uint32_t acc0 = 0U;
  for (uint32_t i = 0U; i < 128U; i++)
  {
    uint32_t beq = FStar_UInt32_eq_mask(one[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(one[i], n[i]);
    acc0 = (beq & acc0) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U)));
  }
  uint32_t m1 = acc0;
  uint32_t m00 = m0 & m1;
  uint32_t bn_zero[128U] = { 0U };
  uint32_t mask = 0xFFFFFFFFU;
  for (uint32_t i = 0U; i < 128U; i++)
  {
    uint32_t uu____0 = FStar_UInt32_eq_mask(a[i], bn_zero[i]);
    mask = uu____0 & mask;
  }
  uint32_t mask1 = mask;
  uint32_t res10 = mask1;
  uint32_t m10 = res10;
  uint32_t acc = 0U;
  for (uint32_t i = 0U; i < 128U; i++)
  {
    uint32_t beq = FStar_UInt32_eq_mask(a[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(a[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U)));
  }
  uint32_t m2 = acc;
  uint32_t is_valid_m = (m00 & ~m10) & m2;
  uint32_t nBits = 32U * Hacl_Bignum_Lib_bn_get_top_index_u32(128U, n);
  if (is_valid_m == 0xFFFFFFFFU)
  {
    uint32_t n2[128U] = { 0U };
    uint32_t c0 = Lib_IntTypes_Intrinsics_sub_borrow_u32(0U, n[0U], 2U, n2);
    uint32_t *a1 = n + 1U;
    uint32_t *res1 = n2 + 1U;
    uint32_t c = c0;
    for (uint32_t i = 0U; i < 31U; i++)
    {
      uint32_t t1 = a1[4U * i];
      uint32_t *res_i0 = res1 + 4U * i;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t1, 0U, res_i0);
      uint32_t t10 = a1[4U * i + 1U];
      uint32_t *res_i1 = res1 + 4U * i + 1U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t10, 0U, res_i1);
      uint32_t t11 = a1[4U * i + 2U];
      uint32_t *res_i2 = res1 + 4U * i + 2U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t11, 0U, res_i2);
      uint32_t t12 = a1[4U * i + 3U];
      uint32_t *res_i = res1 + 4U * i + 3U;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t12, 0U, res_i);
    }
    KRML_MAYBE_FOR3(i,
      124U,
      127U,
      1U,
      uint32_t t1 = a1[i];
      uint32_t *res_i = res1 + i;
      c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t1, 0U, res_i););
    uint32_t c1 = c;
    uint32_t c2 = c1;
    KRML_MAYBE_UNUSED_VAR(c2);
    exp_vartime(nBits, n, a, 4096U, n2, res);
  }
  else
  {
    memset(res, 0U, 128U * sizeof (uint32_t));
  }
  return is_valid_m == 0xFFFFFFFFU;
}